

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

int Vec_WrdRemove(Vec_Wrd_t *p,word Entry)

{
  uint uVar1;
  word *pwVar2;
  int in_EAX;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = p->nSize;
  lVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar3 == uVar6) {
      if (-1 < (int)uVar1) {
        return in_EAX;
      }
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x355,"int Vec_WrdRemove(Vec_Wrd_t *, word)");
    }
    pwVar2 = p->pArray;
    if (pwVar2[uVar3] == Entry) break;
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 8;
  }
  for (lVar5 = 1; (int)uVar3 + (int)lVar5 < (int)uVar1; lVar5 = lVar5 + 1) {
    *(undefined8 *)((long)pwVar2 + lVar5 * 8 + lVar4 + -8) =
         *(undefined8 *)((long)pwVar2 + lVar5 * 8 + lVar4);
  }
  p->nSize = uVar1 - 1;
  return in_EAX;
}

Assistant:

static inline int Vec_WrdRemove( Vec_Wrd_t * p, word Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    if ( i == p->nSize )
        return 0;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
    return 1;
}